

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

xmlHashTablePtr xmlHashCreate(int size)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  ulong uVar3;
  _xmlHashEntry *__s;
  
  pxVar2 = (xmlHashTablePtr)(*xmlMalloc)(0x20);
  if (pxVar2 != (xmlHashTablePtr)0x0) {
    uVar3 = 0x100;
    if (0 < size) {
      uVar3 = (ulong)(uint)size;
    }
    pxVar2->dict = (xmlDictPtr)0x0;
    pxVar2->size = (int)uVar3;
    pxVar2->nbElems = 0;
    __s = (_xmlHashEntry *)(*xmlMalloc)(uVar3 * 0x30);
    pxVar2->table = __s;
    if (__s != (_xmlHashEntry *)0x0) {
      memset(__s,0,uVar3 * 0x30);
      iVar1 = __xmlRandom();
      pxVar2->random_seed = iVar1;
      return pxVar2;
    }
    (*xmlFree)(pxVar2);
  }
  return (xmlHashTablePtr)0x0;
}

Assistant:

xmlHashTablePtr
xmlHashCreate(int size) {
    xmlHashTablePtr table;

    if (size <= 0)
        size = 256;

    table = xmlMalloc(sizeof(xmlHashTable));
    if (table) {
        table->dict = NULL;
        table->size = size;
	table->nbElems = 0;
        table->table = xmlMalloc(size * sizeof(xmlHashEntry));
        if (table->table) {
	    memset(table->table, 0, size * sizeof(xmlHashEntry));
#ifdef HASH_RANDOMIZATION
            table->random_seed = __xmlRandom();
#endif
	    return(table);
        }
        xmlFree(table);
    }
    return(NULL);
}